

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameCollaborativeGraphical.cpp
# Opt level: O2

void __thiscall
BayesianGameCollaborativeGraphical::AddLRF(BayesianGameCollaborativeGraphical *this,Scope *s)

{
  uint uVar1;
  pointer puVar2;
  bool bVar3;
  int iVar4;
  const_reference pvVar5;
  undefined4 extraout_var;
  pointer puVar6;
  BayesianGameIdenticalPayoff *this_00;
  E *pEVar7;
  uint uVar8;
  pointer puVar9;
  ulong nrAgents;
  vector<unsigned_long,_std::allocator<unsigned_long>_> nrActions;
  vector<unsigned_long,_std::allocator<unsigned_long>_> nrTypes;
  Scope sSorted;
  BayesianGameIdenticalPayoff *local_38;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&sSorted.super_SDT,&s->super_SDT)
  ;
  Scope::Sort(&sSorted);
  bVar3 = Scope::Equals(&sSorted,s);
  if (!bVar3) {
    pEVar7 = (E *)__cxa_allocate_exception(0x28);
    E::E(pEVar7,"BayesianGameCollaborativeGraphical::AddLRF() Scope should always be sorted");
    __cxa_throw(pEVar7,&E::typeinfo,E::~E);
  }
  puVar6 = (s->super_SDT).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (s->super_SDT).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  puVar9 = puVar6;
  if (puVar6 != puVar2) {
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                       (&s->super_SDT,((long)puVar2 - (long)puVar6 >> 2) - 1);
    uVar8 = *pvVar5;
    iVar4 = (*(this->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
              super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
              _vptr_Interface_ProblemToPolicyDiscrete[3])(this);
    if (CONCAT44(extraout_var,iVar4) <= (ulong)uVar8) {
      pEVar7 = (E *)__cxa_allocate_exception(0x28);
      E::E(pEVar7,"BayesianGameCollaborativeGraphical::AddLRF() Scope contains non-existing agent!")
      ;
      __cxa_throw(pEVar7,&E::typeinfo,E::~E);
    }
    puVar6 = (s->super_SDT).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar9 = (s->super_SDT).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
  }
  this->_m_nrLRFs = this->_m_nrLRFs + 1;
  nrActions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  nrTypes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  nrAgents = (long)puVar9 - (long)puVar6 >> 2;
  nrActions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  nrActions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  nrTypes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  nrTypes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  for (uVar8 = 0; uVar8 < nrAgents; uVar8 = uVar8 + 1) {
    uVar1 = (s->super_SDT).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start[uVar8];
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              (&nrActions,
               (this->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
               _m_nrActions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start + uVar1);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              (&nrTypes,(this->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
                        _m_nrTypes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                        ._M_impl.super__Vector_impl_data._M_start + uVar1);
  }
  this_00 = (BayesianGameIdenticalPayoff *)operator_new(0xe8);
  BayesianGameIdenticalPayoff::BayesianGameIdenticalPayoff
            (this_00,nrAgents,&nrActions,&nrTypes,true);
  local_38 = this_00;
  std::vector<BayesianGameIdenticalPayoff*,std::allocator<BayesianGameIdenticalPayoff*>>::
  emplace_back<BayesianGameIdenticalPayoff*>
            ((vector<BayesianGameIdenticalPayoff*,std::allocator<BayesianGameIdenticalPayoff*>> *)
             &this->_m_LRFs,&local_38);
  std::vector<Scope,_std::allocator<Scope>_>::push_back(&this->_m_agentScopes,s);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&nrTypes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&nrActions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&sSorted);
  return;
}

Assistant:

void 
BayesianGameCollaborativeGraphical::AddLRF(const Scope &s)
{
    // check whether the scope is sorted, i.e., agent indices are in
    // ascending order
    Scope sSorted=s;
    sSorted.Sort();
    if(!sSorted.Equals(s))
        throw(E("BayesianGameCollaborativeGraphical::AddLRF() Scope should always be sorted"));

    if(! s.empty() )
    {
        Index highestAgentI = s.at(s.size()-1);
        if (highestAgentI >= GetNrAgents() )
            throw(E("BayesianGameCollaborativeGraphical::AddLRF() Scope contains non-existing agent!"));
    }

    _m_nrLRFs++;
    size_t nrAgentsThisLRF = s.size();
    vector<size_t> nrActions;
    vector<size_t> nrTypes;
    for(Index s_I = 0; s_I < nrAgentsThisLRF; s_I++)
    {
        Index agentI=s[s_I];
        nrActions.push_back( _m_nrActions[agentI] );
        nrTypes.push_back( _m_nrTypes[agentI] );
    }
    bool useSparseRewardModel=true;
    _m_LRFs.push_back( new BayesianGameIdenticalPayoff(nrAgentsThisLRF,
                                                       nrActions, nrTypes,
                                                       useSparseRewardModel ) );
    _m_agentScopes.push_back(s);
}